

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O3

int Abs_GiaSortNodes(Gia_Man_t *p,Vec_Int_t *vSupp)

{
  int iVar1;
  int Entry;
  ulong uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar1 = vSupp->nSize;
  uVar8 = (ulong)iVar1;
  iVar5 = iVar1;
  iVar4 = iVar1;
  if (0 < (long)uVar8) {
    uVar7 = 0;
    do {
      iVar4 = vSupp->pArray[uVar7];
      lVar6 = (long)iVar4;
      if ((lVar6 < 0) || (p->nObjs <= iVar4)) goto LAB_0057dc32;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (((uVar7 < uVar8) && (p->pRefs[lVar6] == 0)) &&
         ((uVar2 = *(ulong *)(p->pObjs + lVar6), ((uint)uVar2 & 0x9fffffff) != 0x9fffffff ||
          ((int)((uint)(uVar2 >> 0x20) & 0x1fffffff) < p->vCis->nSize - p->nRegs)))) {
        if ((uVar2 >> 0x3e & 1) == 0) {
          __assert_fail("pObj->fMark1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                        ,0x1b1,"int Abs_GiaSortNodes(Gia_Man_t *, Vec_Int_t *)");
        }
        Vec_IntPush(vSupp,iVar4);
        iVar5 = vSupp->nSize;
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)iVar5);
    iVar4 = iVar5;
    if (0 < iVar5) {
      uVar7 = 0;
      do {
        Entry = vSupp->pArray[uVar7];
        lVar6 = (long)Entry;
        if ((lVar6 < 0) || (p->nObjs <= Entry)) {
LAB_0057dc32:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if ((uVar7 < uVar8) &&
           ((p->pRefs[lVar6] != 0 ||
            ((uVar3 = *(undefined8 *)(p->pObjs + lVar6), ((uint)uVar3 & 0x9fffffff) == 0x9fffffff &&
             (p->vCis->nSize - p->nRegs <= (int)((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff))))))) {
          Vec_IntPush(vSupp,Entry);
          iVar4 = vSupp->nSize;
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)iVar4);
    }
  }
  if (iVar4 != iVar1 * 2) {
    __assert_fail("Vec_IntSize(vSupp) == 2 * nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                  ,0x1b8,"int Abs_GiaSortNodes(Gia_Man_t *, Vec_Int_t *)");
  }
  memmove(vSupp->pArray,vSupp->pArray + uVar8,uVar8 << 2);
  if (vSupp->nSize < iVar1) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  vSupp->nSize = iVar1;
  return iVar5 - iVar1;
}

Assistant:

int Abs_GiaSortNodes( Gia_Man_t * p, Vec_Int_t * vSupp )
{
    Gia_Obj_t * pObj;
    int nSize = Vec_IntSize(vSupp);
    int i, RetValue;
    Gia_ManForEachObjVec( vSupp, p, pObj, i )
        if ( i < nSize && Gia_ObjRefNum(p, pObj) == 0 && !Gia_ObjIsRo(p, pObj) ) // add removable leaves
        {
            assert( pObj->fMark1 );
            Vec_IntPush( vSupp, Gia_ObjId(p, pObj) );
        }
    RetValue = Vec_IntSize(vSupp) - nSize;
    Gia_ManForEachObjVec( vSupp, p, pObj, i )
        if ( i < nSize && !(Gia_ObjRefNum(p, pObj) == 0 && !Gia_ObjIsRo(p, pObj)) ) // add non-removable leaves
            Vec_IntPush( vSupp, Gia_ObjId(p, pObj) );
    assert( Vec_IntSize(vSupp) == 2 * nSize );
    memmove( Vec_IntArray(vSupp), Vec_IntArray(vSupp) + nSize, sizeof(int) * nSize );
    Vec_IntShrink( vSupp, nSize );
    return RetValue;
}